

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int selectColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  char *pcVar1;
  u8 uVar2;
  byte bVar3;
  ExprList_item *pEVar4;
  Table *pTVar5;
  uint uVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  int extraout_EAX;
  Column *__s;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  uint uVar14;
  Expr *pEVar15;
  char *pcVar16;
  byte *pbVar17;
  Column *pCVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  
  if (pEList == (ExprList *)0x0) {
    *pnCol = 0;
    *paCol = (Column *)0x0;
    __s = (Column *)0x0;
  }
  else {
    uVar19 = pEList->nExpr;
    uVar11 = (ulong)uVar19;
    __s = (Column *)sqlite3DbMallocRaw((sqlite3 *)pParse,uVar19 * 0x30);
    if (__s != (Column *)0x0) {
      memset(__s,0,(long)(int)(uVar19 * 0x30));
    }
    *pnCol = (i16)uVar19;
    *paCol = __s;
    if (0 < (int)uVar19) {
      uVar20 = 0;
      pCVar18 = __s;
      do {
        pEVar4 = pEList->a;
        for (pEVar15 = pEVar4[uVar20].pExpr; pEVar15 != (Expr *)0x0; pEVar15 = pEVar15->pLeft) {
          if ((pEVar15->op != '\\') && (pEVar15->op != '\x18')) goto LAB_0015be6c;
        }
        pEVar15 = (Expr *)0x0;
LAB_0015be6c:
        pcVar16 = pEVar4[uVar20].zName;
        if (pcVar16 == (char *)0x0) {
          for (; uVar2 = pEVar15->op, uVar2 == 'v'; pEVar15 = pEVar15->pRight) {
          }
          if (uVar2 == '\x1a') {
            pcVar16 = (pEVar15->u).zToken;
          }
          else if ((uVar2 == 0x98) && (pTVar5 = pEVar15->pTab, pTVar5 != (Table *)0x0)) {
            uVar7 = pEVar15->iColumn;
            if ((short)uVar7 < 0) {
              uVar7 = pTVar5->iPKey;
              pcVar16 = "rowid";
              if ((short)uVar7 < 0) goto LAB_0015bf3e;
            }
            pcVar16 = *(char **)((long)&pTVar5->aCol->zName + (ulong)((uint)uVar7 * 0x30));
          }
          else {
            pcVar16 = pEVar4[uVar20].zSpan;
          }
LAB_0015bf3e:
          pbVar10 = (byte *)sqlite3MPrintf((sqlite3 *)pParse,"%s",pcVar16);
LAB_0015bf57:
          if ((char)pParse->nErr != '\0') {
LAB_0015c0d4:
            sqlite3DbFree((sqlite3 *)pParse,pbVar10);
            uVar11 = uVar20 & 0xffffffff;
            break;
          }
          if (pbVar10 == (byte *)0x0) {
            pbVar10 = (byte *)0x0;
            uVar19 = 0;
          }
          else {
            lVar22 = 0;
            do {
              pbVar17 = pbVar10 + lVar22;
              lVar22 = lVar22 + 1;
            } while (*pbVar17 != 0);
            uVar19 = (int)lVar22 - 1U & 0x3fffffff;
          }
        }
        else {
          lVar22 = 0;
          do {
            pcVar1 = pcVar16 + lVar22;
            lVar22 = lVar22 + 1;
          } while (*pcVar1 != '\0');
          uVar19 = ((int)lVar22 - 1U & 0x3fffffff) + 1;
          pbVar10 = (byte *)sqlite3DbMallocRaw((sqlite3 *)pParse,uVar19);
          if (pbVar10 != (byte *)0x0) {
            memcpy(pbVar10,pcVar16,(ulong)uVar19);
            goto LAB_0015bf57;
          }
          pbVar10 = (byte *)0x0;
          uVar19 = 0;
          if ((char)pParse->nErr != '\0') goto LAB_0015c0d4;
        }
        if (uVar20 != 0) {
          iVar9 = 0;
          uVar21 = 0;
          pbVar17 = pbVar10;
          do {
            pbVar10 = (byte *)__s[iVar9].zName;
            bVar3 = *pbVar10;
            pbVar12 = pbVar17;
            while (bVar3 != 0) {
              uVar13 = (ulong)bVar3;
              pbVar10 = pbVar10 + 1;
              if (""[uVar13] != ""[*pbVar12]) goto LAB_0015bfd9;
              pbVar12 = pbVar12 + 1;
              bVar3 = *pbVar10;
            }
            uVar13 = 0;
LAB_0015bfd9:
            pbVar10 = pbVar17;
            if (""[uVar13] == ""[*pbVar12]) {
              uVar8 = 2;
              if ((int)uVar19 < 2) {
                uVar8 = uVar19;
              }
              uVar13 = (ulong)uVar19;
              uVar6 = uVar19;
              do {
                uVar13 = uVar13 - 1;
                uVar14 = uVar8 - 1;
                if ((int)uVar6 < 3) break;
                uVar14 = uVar6 - 1;
                uVar6 = uVar14;
              } while (0xfffffffffffffff5 < (ulong)pbVar17[uVar13 & 0xffffffff] - 0x3a);
              if (pbVar17[(int)uVar14] == 0x3a) {
                uVar19 = uVar14;
              }
              pbVar17[(int)uVar19] = 0;
              uVar21 = (ulong)((int)uVar21 + 1);
              pbVar10 = (byte *)sqlite3MPrintf((sqlite3 *)pParse,"%s:%d",pbVar17,uVar21);
              sqlite3DbFree((sqlite3 *)pParse,pbVar17);
              if (pbVar10 == (byte *)0x0) {
                pbVar10 = (byte *)0x0;
                break;
              }
              iVar9 = -1;
            }
            iVar9 = iVar9 + 1;
            pbVar17 = pbVar10;
          } while ((long)iVar9 < (long)uVar20);
        }
        pCVar18->zName = (char *)pbVar10;
        uVar20 = uVar20 + 1;
        pCVar18 = pCVar18 + 1;
      } while (uVar20 != uVar11);
      goto LAB_0015c0f4;
    }
  }
  uVar11 = 0;
LAB_0015c0f4:
  iVar9 = (int)uVar11;
  if ((char)pParse->nErr != '\0') {
    if (iVar9 != 0) {
      lVar22 = 0;
      do {
        sqlite3DbFree((sqlite3 *)pParse,*(void **)((long)&__s->zName + lVar22));
        lVar22 = lVar22 + 0x30;
      } while (uVar11 * 0x30 != lVar22);
    }
    sqlite3DbFree((sqlite3 *)pParse,__s);
    *paCol = (Column *)0x0;
    *pnCol = 0;
    iVar9 = extraout_EAX;
  }
  return iVar9;
}

Assistant:

static int selectColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  int cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  Expr *p;                    /* Expression for a single result column */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */

  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
  }else{
    nCol = 0;
    aCol = 0;
  }
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol; i++, pCol++){
    /* Get an appropriate name for the column
    */
    p = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
      zName = sqlite3DbStrDup(db, zName);
    }else{
      Expr *pColExpr = p;  /* The expression that is the result column name */
      Table *pTab;         /* Table associated with this expression */
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN && ALWAYS(pColExpr->pTab!=0) ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = sqlite3MPrintf(db, "%s",
                 iCol>=0 ? pTab->aCol[iCol].zName : "rowid");
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = sqlite3MPrintf(db, "%s", pColExpr->u.zToken);
      }else{
        /* Use the original text of the column expression as its name */
        zName = sqlite3MPrintf(db, "%s", pEList->a[i].zSpan);
      }
    }
    if( db->mallocFailed ){
      sqlite3DbFree(db, zName);
      break;
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append a integer to the name so that it becomes unique.
    */
    nName = sqlite3Strlen30(zName);
    for(j=cnt=0; j<i; j++){
      if( sqlite3StrICmp(aCol[j].zName, zName)==0 ){
        char *zNewName;
        int k;
        for(k=nName-1; k>1 && sqlite3Isdigit(zName[k]); k--){}
        if( zName[k]==':' ) nName = k;
        zName[nName] = 0;
        zNewName = sqlite3MPrintf(db, "%s:%d", zName, ++cnt);
        sqlite3DbFree(db, zName);
        zName = zNewName;
        j = -1;
        if( zName==0 ) break;
      }
    }
    pCol->zName = zName;
  }
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM;
  }
  return SQLITE_OK;
}